

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

void mmk_init(void)

{
  if (self_0 == '\0') {
    self_1 = plt_init_ctx();
    if (self_1 == (plt_ctx)0xffffffffffffffff) {
      mmk_fprintf(_stderr,"%s:%d: Assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/Snaipe[P]Mimick/src/core.c",
                  0x2d,"self.plt != (void*) -1");
      mmk_abort();
    }
    mmk_init_vital_functions(self_1);
    self_0 = '\x01';
  }
  return;
}

Assistant:

void mmk_init(void)
{
    if (self.initialized)
        return;

    self.plt = plt_init_ctx();
    mmk_assert(self.plt != (void*) -1);

    mmk_init_vital_functions(self.plt);

    self.initialized = 1;
}